

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# LE_Vector.h
# Opt level: O1

LE_Vector<KDIS::DATA_TYPE::KFIXED<short,_(unsigned_char)__x03_>_> * __thiscall
KDIS::DATA_TYPE::LE_Vector<KDIS::DATA_TYPE::KFIXED<short,_(unsigned_char)'\x03'>_>::operator=
          (LE_Vector<KDIS::DATA_TYPE::KFIXED<short,_(unsigned_char)__x03_>_> *this,
          LE_Vector<KDIS::DATA_TYPE::KFIXED<short,_(unsigned_char)__x03_>_> *param_1)

{
  DataTypeBase local_80;
  short local_78;
  KFIXED<short,_(unsigned_char)__x03_> local_70;
  DataTypeBase local_60;
  short local_58;
  KFIXED<short,_(unsigned_char)__x03_> local_50;
  DataTypeBase local_40;
  short local_38;
  KFIXED<short,_(unsigned_char)__x03_> local_30;
  
  local_40._vptr_DataTypeBase = (_func_int **)&PTR__DataTypeBase_00221b30;
  local_38 = (param_1->m_X).m_Val;
  KFIXED<short,_(unsigned_char)'\x03'>::operator=(&local_30,&this->m_X);
  DataTypeBase::~DataTypeBase(&local_30.super_DataTypeBase);
  DataTypeBase::~DataTypeBase(&local_40);
  local_60._vptr_DataTypeBase = (_func_int **)&PTR__DataTypeBase_00221b30;
  local_58 = (param_1->m_Y).m_Val;
  KFIXED<short,_(unsigned_char)'\x03'>::operator=(&local_50,&this->m_Y);
  DataTypeBase::~DataTypeBase(&local_50.super_DataTypeBase);
  DataTypeBase::~DataTypeBase(&local_60);
  local_80._vptr_DataTypeBase = (_func_int **)&PTR__DataTypeBase_00221b30;
  local_78 = (param_1->m_Z).m_Val;
  KFIXED<short,_(unsigned_char)'\x03'>::operator=(&local_70,&this->m_Z);
  DataTypeBase::~DataTypeBase(&local_70.super_DataTypeBase);
  DataTypeBase::~DataTypeBase(&local_80);
  return this;
}

Assistant:

class KDIS_EXPORT LE_Vector : public DataTypeBase
{
protected:

    Type m_X;

    Type m_Y;

    Type m_Z;

public:

    static const KUINT16 LE_VECTOR_SIZE = sizeof( typename Type::ValueType ) * 3;

    LE_Vector();

    LE_Vector( Type X, Type Y, Type Z );

    LE_Vector(KDataStream &stream) noexcept(false);

    virtual ~LE_Vector();

    //************************************
    // FullName:    KDIS::DATA_TYPE::LE_Vector::SetX
    //              KDIS::DATA_TYPE::LE_Vector::GetX
    // Description: First Value / X
    // Parameter:   Type  X
    //************************************
    void SetX( Type X );
    Type GetX() const;

    //************************************
    // FullName:    KDIS::DATA_TYPE::LE_Vector::SetY
    //              KDIS::DATA_TYPE::LE_Vector::GetY
    // Description: Second Value / Y
    // Parameter:   Type Y
    //************************************
    void SetY( Type Y );
    Type GetY() const;

    //************************************
    // FullName:    KDIS::DATA_TYPE::LE_Vector::SetZ
    //              KDIS::DATA_TYPE::LE_Vector::GetZ
    // Description: Third Value / Z
    // Parameter:   Type Z
    //************************************
    void SetZ( Type Z );
    Type GetZ() const;

    //************************************
    // FullName:    KDIS::DATA_TYPE::LE_Vector::GetAsString
    // Description: Returns a string representation
    //************************************
    virtual KString GetAsString() const;

    //************************************
    // FullName:    KDIS::DATA_TYPE::LE_Vector::Decode
    // Description: Convert From Network Data.
    // Parameter:   KDataStream & stream
    //************************************
    virtual void Decode(KDataStream &stream) noexcept(false);

    //************************************
    // FullName:    KDIS::DATA_TYPE::LE_Vector::Encode
    // Description: Convert To Network Data.
    // Parameter:   KDataStream & stream
    //************************************
    virtual KDataStream Encode() const;
    virtual void Encode( KDataStream & stream ) const;

    KBOOL operator == ( const LE_Vector & Value ) const;
    KBOOL operator != ( const LE_Vector & Value ) const;
    LE_Vector operator * ( const LE_Vector & Value ) const;
    LE_Vector operator * ( KFLOAT64 Value ) const;
    LE_Vector operator + ( const LE_Vector & Value ) const;
    LE_Vector & operator += ( const LE_Vector & Value );
    LE_Vector operator - ( const LE_Vector & Value ) const;
    LE_Vector & operator -= ( const LE_Vector & Value );

    // Valid values 0 - X, 1 - Y, 2 - Z. throws OUT_OF_BOUNDS exception for any other value.
    Type &operator[](KUINT16 i) noexcept(false);

    const Type &operator[](KUINT16 i) const noexcept(false);
}